

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O0

bool jbcoin::passesLocalChecks(STObject *st,string *reason)

{
  bool bVar1;
  string *reason_local;
  STObject *st_local;
  
  bVar1 = isMemoOkay(st,reason);
  if (bVar1) {
    bVar1 = isAccountFieldOkay(st);
    if (bVar1) {
      bVar1 = isPseudoTx(st);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)reason,"Cannot submit pseudo transactions.");
        st_local._7_1_ = false;
      }
      else {
        st_local._7_1_ = true;
      }
    }
    else {
      std::__cxx11::string::operator=((string *)reason,"An account field is invalid.");
      st_local._7_1_ = false;
    }
  }
  else {
    st_local._7_1_ = false;
  }
  return st_local._7_1_;
}

Assistant:

bool passesLocalChecks (STObject const& st, std::string& reason)
{
    if (!isMemoOkay (st, reason))
        return false;

    if (!isAccountFieldOkay (st))
    {
        reason = "An account field is invalid.";
        return false;
    }

    if (isPseudoTx(st))
    {
        reason = "Cannot submit pseudo transactions.";
        return false;
    }
    return true;
}